

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O3

void __thiscall
ParticleArrayTest_Size_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>_>::TestBody
          (ParticleArrayTest_Size_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>_>
           *this)

{
  PositionType minPosition;
  PositionType maxPosition;
  bool bVar1;
  long lVar2;
  uint uVar3;
  Particle *pPVar4;
  iterator iVar5;
  char *message;
  byte bVar6;
  int numParticles;
  ParticleArray particles;
  PositionType position;
  PositionType position_1;
  AssertionResult gtest_ar;
  int local_dc;
  void *local_d8;
  iterator iStack_d0;
  Particle<(pica::Dimension)3> *local_c8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  AssertHelper local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  Particle local_78;
  
  bVar6 = 0;
  local_d8 = (void *)0x0;
  iStack_d0._M_current = (Particle<(pica::Dimension)3> *)0x0;
  local_c8 = (Particle<(pica::Dimension)3> *)0x0;
  local_dc = 0xc;
  uVar3 = 0xffffffff;
  do {
    local_b8.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0xc024000000000000;
    uStack_b0 = 0xc024000000000000;
    local_a8 = 0xc024000000000000;
    local_98.data_ = (AssertHelperData *)0x4024000000000000;
    uStack_90 = 0x4024000000000000;
    local_88 = 0x4024000000000000;
    minPosition.y = -10.0;
    minPosition.x = -10.0;
    minPosition.z = -10.0;
    maxPosition.y = 10.0;
    maxPosition.x = 10.0;
    maxPosition.z = 10.0;
    BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
              (&local_78,(BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *)this,
               minPosition,maxPosition);
    if (iStack_d0._M_current == local_c8) {
      std::
      vector<pica::Particle<(pica::Dimension)3>,std::allocator<pica::Particle<(pica::Dimension)3>>>
      ::_M_realloc_insert<pica::Particle<(pica::Dimension)3>const&>
                ((vector<pica::Particle<(pica::Dimension)3>,std::allocator<pica::Particle<(pica::Dimension)3>>>
                  *)&local_d8,iStack_d0,&local_78);
    }
    else {
      pPVar4 = &local_78;
      iVar5._M_current = iStack_d0._M_current;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        ((iVar5._M_current)->position).x = (pPVar4->position).x;
        pPVar4 = (Particle *)((long)pPVar4 + (ulong)bVar6 * -0x10 + 8);
        iVar5._M_current = iVar5._M_current + (ulong)bVar6 * -0x10 + 8;
      }
      iStack_d0._M_current = iStack_d0._M_current + 1;
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 < 0xb);
  local_b8.ptr_._0_4_ =
       (int)((ulong)((long)iStack_d0._M_current - (long)local_d8) >> 3) * 0x38e38e39;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_78,"numParticles","particles.size()",&local_dc,(int *)&local_b8);
  if (local_78.position.x._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_b8);
    if ((undefined8 *)local_78.position.y == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_78.position.y;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x45,message);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_b8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_b8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_b8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78.position.y,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_d8 != (void *)0x0) {
    operator_delete(local_d8,(long)local_c8 - (long)local_d8);
  }
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Size)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    int numParticles = 12;
    for (int i = 0; i < numParticles; i++)
        particles.pushBack(this->randomParticle());
    ASSERT_EQ(numParticles, particles.size());
}